

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_ecdsa_recoverable_signature_convert
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,
              secp256k1_ecdsa_recoverable_signature *sigin)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  void *pvVar8;
  char *pcVar9;
  secp256k1_scalar s;
  
  if (ctx == (secp256k1_context *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/modules/recovery/main_impl.h"
            ,0x4e,"test condition failed: ctx != NULL");
    abort();
  }
  if (sig == (secp256k1_ecdsa_signature *)0x0) {
    pvVar8 = (ctx->illegal_callback).data;
    pcVar9 = "sig != NULL";
  }
  else {
    if (sigin != (secp256k1_ecdsa_recoverable_signature *)0x0) {
      uVar1 = *(undefined8 *)(sigin->data + 0x20);
      uVar2 = *(undefined8 *)(sigin->data + 0x28);
      uVar3 = *(undefined8 *)(sigin->data + 0x30);
      uVar4 = *(undefined8 *)(sigin->data + 0x38);
      uVar5 = *(undefined8 *)sigin->data;
      uVar6 = *(undefined8 *)(sigin->data + 8);
      uVar7 = *(undefined8 *)(sigin->data + 0x18);
      *(undefined8 *)(sig->data + 0x10) = *(undefined8 *)(sigin->data + 0x10);
      *(undefined8 *)(sig->data + 0x18) = uVar7;
      *(undefined8 *)sig->data = uVar5;
      *(undefined8 *)(sig->data + 8) = uVar6;
      *(undefined8 *)(sig->data + 0x20) = uVar1;
      *(undefined8 *)(sig->data + 0x28) = uVar2;
      *(undefined8 *)(sig->data + 0x30) = uVar3;
      *(undefined8 *)(sig->data + 0x38) = uVar4;
      return 1;
    }
    pvVar8 = (ctx->illegal_callback).data;
    pcVar9 = "sigin != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar9,pvVar8);
  return 0;
}

Assistant:

int secp256k1_ecdsa_recoverable_signature_convert(const secp256k1_context* ctx, secp256k1_ecdsa_signature* sig, const secp256k1_ecdsa_recoverable_signature* sigin) {
    secp256k1_scalar r, s;
    int recid;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(sigin != NULL);

    secp256k1_ecdsa_recoverable_signature_load(ctx, &r, &s, &recid, sigin);
    secp256k1_ecdsa_signature_save(sig, &r, &s);
    return 1;
}